

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool tidyNodeGetValue(TidyDoc tdoc,TidyNode tnod,TidyBuffer *buf)

{
  Node *node;
  TidyDocImpl *doc;
  TidyBuffer *buf_local;
  TidyNode tnod_local;
  TidyDoc tdoc_local;
  
  if (((tdoc == (TidyDoc)0x0) || (tnod == (TidyNode)0x0)) || (buf == (TidyBuffer *)0x0)) {
    tdoc_local._4_4_ = no;
  }
  else if ((tnod[0x14]._opaque - 2U < 3) || (tnod[0x14]._opaque - 8U < 5)) {
    tidyBufClear(buf);
    tidyBufAppend(buf,(void *)(*(long *)(*(long *)(tdoc + 0x1a) + 0x68) +
                              (ulong)(uint)tnod[0x12]._opaque),
                  tnod[0x13]._opaque - tnod[0x12]._opaque);
    tdoc_local._4_4_ = yes;
  }
  else {
    tdoc_local._4_4_ = no;
  }
  return tdoc_local._4_4_;
}

Assistant:

Bool TIDY_CALL tidyNodeGetValue( TidyDoc tdoc, TidyNode tnod, TidyBuffer* buf )
{
    TidyDocImpl *doc = tidyDocToImpl( tdoc );
    Node *node = tidyNodeToImpl( tnod );
    if ( doc == NULL || node == NULL || buf == NULL )
        return no;

    switch( node->type ) {
    case TextNode:
    case CDATATag:
    case CommentTag:
    case ProcInsTag:
    case SectionTag:
    case AspTag:
    case JsteTag:
    case PhpTag:
    {
        tidyBufClear( buf );
        tidyBufAppend( buf, doc->lexer->lexbuf + node->start,
                       node->end - node->start );
        break;
    }
    default:
        /* The node doesn't have a value */
        return no;
    }

    return yes;
}